

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtablez_sampler.cc
# Opt level: O3

HashtablezSampler * absl::lts_20240722::container_internal::GlobalHashtablezSampler(void)

{
  int iVar1;
  
  if (GlobalHashtablezSampler()::sampler == '\0') {
    iVar1 = __cxa_guard_acquire(&GlobalHashtablezSampler()::sampler);
    if (iVar1 != 0) {
      profiling_internal::SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo>::
      SampleRecorder((SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *)
                     &GlobalHashtablezSampler::sampler);
      __cxa_guard_release(&GlobalHashtablezSampler()::sampler);
    }
  }
  return (HashtablezSampler *)&GlobalHashtablezSampler::sampler;
}

Assistant:

HashtablezSampler& GlobalHashtablezSampler() {
  static absl::NoDestructor<HashtablezSampler> sampler;
  return *sampler;
}